

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
kj::ArrayBuilder<capnp::compiler::NodeTranslator::AuxNode>::dispose
          (ArrayBuilder<capnp::compiler::NodeTranslator::AuxNode> *this)

{
  AuxNode *firstElement;
  RemoveConst<capnp::compiler::NodeTranslator::AuxNode> *pRVar1;
  AuxNode *pAVar2;
  AuxNode *endCopy;
  AuxNode *posCopy;
  AuxNode *ptrCopy;
  ArrayBuilder<capnp::compiler::NodeTranslator::AuxNode> *this_local;
  
  firstElement = this->ptr;
  pRVar1 = this->pos;
  pAVar2 = this->endPtr;
  if (firstElement != (AuxNode *)0x0) {
    this->ptr = (AuxNode *)0x0;
    this->pos = (RemoveConst<capnp::compiler::NodeTranslator::AuxNode> *)0x0;
    this->endPtr = (AuxNode *)0x0;
    ArrayDisposer::dispose<capnp::compiler::NodeTranslator::AuxNode>
              (this->disposer,firstElement,(long)pRVar1 - (long)firstElement >> 6,
               (long)pAVar2 - (long)firstElement >> 6);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }